

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Printer::Print
          (Printer *this,Message *message,ZeroCopyOutputStream *output,FieldReporterLevel reporter)

{
  bool single_line_mode;
  bool redact;
  bool randomize;
  byte bVar1;
  TextGenerator generator;
  BaseTextGenerator local_58;
  ZeroCopyOutputStream *local_50;
  undefined8 local_48;
  uint local_40;
  undefined2 local_3c;
  undefined1 local_3a;
  int local_38;
  int local_34;
  
  local_3a = this->insert_silent_marker_;
  local_38 = this->initial_indent_level_;
  local_58._vptr_BaseTextGenerator = (_func_int **)&PTR__TextGenerator_008531d8;
  local_48 = 0;
  local_40 = 0;
  local_3c = 1;
  single_line_mode = this->single_line_mode_;
  redact = this->redact_debug_string_;
  randomize = this->randomize_debug_string_;
  local_50 = output;
  local_34 = local_38;
  GetGlobalTextMarkerGenerator();
  TextMarkerGenerator::PrintMarker
            (&GetGlobalTextMarkerGenerator::kTextMarkerGenerator,&local_58,redact,randomize,
             single_line_mode);
  Print(this,message,&local_58);
  bVar1 = local_3c._1_1_;
  local_58._vptr_BaseTextGenerator = (_func_int **)&PTR__TextGenerator_008531d8;
  if (local_3c._1_1_ == 0) {
    (*local_50->_vptr_ZeroCopyOutputStream[3])(local_50,(ulong)local_40);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool TextFormat::Printer::Print(const Message& message,
                                io::ZeroCopyOutputStream* output,
                                internal::FieldReporterLevel reporter) const {
  TextGenerator generator(output, insert_silent_marker_, initial_indent_level_);

  internal::PrintTextMarker(&generator, redact_debug_string_,
                            randomize_debug_string_, single_line_mode_);


  Print(message, &generator);

  // Output false if the generator failed internally.
  return !generator.failed();
}